

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O2

void tchecker::refdbm::universal(db_t *rdbm,reference_clock_variables_t *r)

{
  uint __line;
  bool bVar1;
  size_t sVar2;
  char *__assertion;
  
  if (rdbm == (db_t *)0x0) {
    __assertion = "rdbm != nullptr";
    __line = 0x20;
  }
  else {
    sVar2 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)r);
    tchecker::dbm::universal(rdbm,(clock_id_t)sVar2);
    bVar1 = is_tight(rdbm,r);
    if (bVar1) {
      bVar1 = is_consistent(rdbm,r);
      if (bVar1) {
        return;
      }
      __assertion = "tchecker::refdbm::is_consistent(rdbm, r)";
      __line = 0x23;
    }
    else {
      __assertion = "tchecker::refdbm::is_tight(rdbm, r)";
      __line = 0x22;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                ,__line,
                "void tchecker::refdbm::universal(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
               );
}

Assistant:

void universal(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r)
{
  assert(rdbm != nullptr);
  tchecker::dbm::universal(rdbm, r.size());
  assert(tchecker::refdbm::is_tight(rdbm, r));
  assert(tchecker::refdbm::is_consistent(rdbm, r));
}